

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

int lj_opt_fwd_tptr(jit_State *J,IRRef lim)

{
  ushort uVar1;
  ushort uVar2;
  IRIns *pIVar3;
  bool bVar4;
  AliasRet AVar5;
  int iVar6;
  uint uVar7;
  
  uVar1 = (J->fold).ins.field_0.op1;
  uVar7 = (uint)J->chain[0x3b];
  do {
    if (uVar7 <= lim) {
      iVar6 = fwd_aa_tab_clear(J,lim,(uint)uVar1);
      return iVar6;
    }
    pIVar3 = (J->cur).ir;
    uVar2 = pIVar3[uVar7].field_0.op1;
    if (uVar1 == uVar2) {
LAB_00125eee:
      bVar4 = false;
    }
    else {
      AVar5 = aa_table(J,(uint)uVar1,(uint)uVar2);
      if (AVar5 != ALIAS_NO) goto LAB_00125eee;
      uVar7 = (uint)*(ushort *)((long)pIVar3 + (ulong)uVar7 * 8 + 6);
      bVar4 = true;
    }
    if (!bVar4) {
      return 0;
    }
  } while( true );
}

Assistant:

int LJ_FASTCALL lj_opt_fwd_tptr(jit_State *J, IRRef lim)
{
  IRRef ta = fins->op1;
  IRRef ref = J->chain[IR_NEWREF];
  while (ref > lim) {
    IRIns *newref = IR(ref);
    if (ta == newref->op1 || aa_table(J, ta, newref->op1) != ALIAS_NO)
      return 0;  /* Conflict. */
    ref = newref->prev;
  }
  return fwd_aa_tab_clear(J, lim, ta);
}